

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O3

int FE_New_Line(FORM *form)

{
  FIELD *field;
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  char *buf;
  
  field = form->current;
  iVar2 = field->drows + -1;
  if ((form->status & 4) != 0) {
    if (iVar2 == form->currow) {
      if (((field->status & 8) == 0) || ((int)field->rows + field->nrow == 1)) {
        if ((form->opts & 1) == 0) {
          return -0xc;
        }
        wclrtoeol(form->w);
        *(byte *)&form->status = (byte)form->status | 0x10;
        goto LAB_003f8cbe;
      }
      _Var1 = Field_Grown(field,1);
      if (!_Var1) {
        return -1;
      }
    }
    wclrtoeol(form->w);
    form->currow = form->currow + 1;
    form->curcol = 0;
    *(byte *)&form->status = (byte)form->status | 0x10;
    return 0;
  }
  if (iVar2 == form->currow) {
    if (((field->status & 8) == 0) || ((int)field->rows + field->nrow == 1)) {
      if ((form->opts & 1) == 0) {
        return -0xc;
      }
LAB_003f8cbe:
      iVar2 = Inter_Field_Navigation(FN_Next_Field,form);
      return iVar2;
    }
  }
  else {
    _Var1 = Is_There_Room_For_A_Line(form);
    if (_Var1) goto LAB_003f8d0c;
    if ((field->status & 8) == 0) {
      return -0xc;
    }
  }
  _Var1 = Field_Grown(field,1);
  if (!_Var1) {
    return -1;
  }
LAB_003f8d0c:
  buf = form->current->buf + (long)form->curcol + (long)form->currow * (long)form->current->dcols;
  pcVar3 = After_End_Of_Data(buf,field->dcols - form->curcol);
  wclrtoeol(form->w);
  iVar2 = form->currow + 1;
  form->currow = iVar2;
  form->curcol = 0;
  wmove(form->w,iVar2,0);
  winsdelln(form->w,1);
  waddnstr(form->w,buf,(int)pcVar3 - (int)buf);
  *(byte *)&form->status = (byte)form->status | 0x10;
  return 0;
}

Assistant:

static int FE_New_Line(FORM * form)
{
  FIELD  *field = form->current;
  char *bp, *t;
  bool Last_Row = ((field->drows - 1)==form->currow);
  
  if (form->status & _OVLMODE) 
    {
      if (Last_Row && 
          (!(Growable(field) && !Single_Line_Field(field))))
        {
          if (!(form->opts & O_NL_OVERLOAD))
            return(E_REQUEST_DENIED);
          wclrtoeol(form->w);
          /* we have to set this here, although it is also
             handled in the generic routine. The reason is,
             that FN_Next_Field may fail, but the form is
             definitively changed */
          form->status |= _WINDOW_MODIFIED;
          return Inter_Field_Navigation(FN_Next_Field,form);
        }
      else 
        {
          if (Last_Row && !Field_Grown(field,1))
            { /* N.B.: due to the logic in the 'if', LastRow==TRUE
                 means here that the field is growable and not
                 a single-line field */
              return(E_SYSTEM_ERROR);
            }
          wclrtoeol(form->w);
          form->currow++;
          form->curcol = 0;
          form->status |= _WINDOW_MODIFIED;
          return(E_OK);
        }
    }
  else 
    { /* Insert Mode */
      if (Last_Row &&
          !(Growable(field) && !Single_Line_Field(field)))
        {
          if (!(form->opts & O_NL_OVERLOAD))
            return(E_REQUEST_DENIED);
          return Inter_Field_Navigation(FN_Next_Field,form);
        }
      else 
        {
          bool May_Do_It = !Last_Row && Is_There_Room_For_A_Line(form);
          
          if (!(May_Do_It || Growable(field)))
            return(E_REQUEST_DENIED);
          if (!May_Do_It && !Field_Grown(field,1))
            return(E_SYSTEM_ERROR);
          
          bp= Address_Of_Current_Position_In_Buffer(form);
          t = After_End_Of_Data(bp,field->dcols - form->curcol);
          wclrtoeol(form->w);
          form->currow++;
          form->curcol=0;
          wmove(form->w,form->currow,form->curcol);
          winsertln(form->w);
          waddnstr(form->w,bp,(int)(t-bp));
          form->status |= _WINDOW_MODIFIED;
          return E_OK;
        }
    }
}